

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::CoreBroker(CoreBroker *this,string_view broker_name)

{
  string_view broker_name_00;
  TimeRepresentation<count_time<9,_long>_> TVar1;
  Broker *in_RDI;
  GlobalFederateId *this_00;
  undefined4 in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  UnknownHandleManager *in_stack_ffffffffffffff30;
  SimpleQueue<helics::ActionMessage,_std::mutex> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 DisableQueue;
  BrokerBase *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  
  DisableQueue = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  Broker::Broker(in_RDI);
  broker_name_00._M_str = in_stack_ffffffffffffffb0;
  broker_name_00._M_len = in_stack_ffffffffffffffa8;
  BrokerBase::BrokerBase(in_stack_ffffffffffffffa0,broker_name_00,(bool)DisableQueue);
  in_RDI->_vptr_Broker = (_func_int **)&PTR__CoreBroker_00961270;
  in_RDI[1]._vptr_Broker = (_func_int **)&DAT_009613c0;
  *(undefined1 *)((long)&in_RDI[0x53]._vptr_Broker + 2) = 0;
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
  *(undefined1 *)((long)&in_RDI[0x53]._vptr_Broker + 4) = 0;
  *(undefined1 *)((long)&in_RDI[0x53]._vptr_Broker + 5) = 0;
  *(undefined1 *)((long)&in_RDI[0x53]._vptr_Broker + 6) = 0;
  *(undefined4 *)&in_RDI[0x54]._vptr_Broker = 1;
  gmlc::containers::
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  ::DualStringMappedVector
            ((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
              *)in_stack_ffffffffffffff30);
  gmlc::containers::
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  ::DualStringMappedVector
            ((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
              *)in_stack_ffffffffffffff30);
  std::__cxx11::string::string(in_stack_ffffffffffffff40);
  HandleManager::HandleManager((HandleManager *)in_stack_ffffffffffffff30);
  UnknownHandleManager::UnknownHandleManager(in_stack_ffffffffffffff30);
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
            *)0x549bd1);
  CLI::std::
  unordered_map<helics::GlobalFederateId,_helics::LocalFederateId,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>_>_>
  ::unordered_map((unordered_map<helics::GlobalFederateId,_helics::LocalFederateId,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>_>_>
                   *)0x549bea);
  CLI::std::
  unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
  ::unordered_map((unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
                   *)0x549c03);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                   *)0x549c1c);
  CLI::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x549c35);
  CLI::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   *)0x549c4e);
  std::mutex::mutex((mutex *)0x549c62);
  std::atomic<int>::atomic
            ((atomic<int> *)in_stack_ffffffffffffff30,
             CONCAT13(in_stack_ffffffffffffff2f,
                      CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c)));
  *(undefined1 *)((long)&in_RDI[0x141]._vptr_Broker + 4) = 0;
  gmlc::concurrency::
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  DelayedObjects((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff30);
  std::
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ::vector((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
            *)0x549cb4);
  std::
  deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ::deque((deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
           *)0x549ccd);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x16c);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::vector
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x549ce8);
  gmlc::concurrency::TriggerVariable::TriggerVariable
            ((TriggerVariable *)in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
  std::make_unique<helics::TimeoutMonitor>();
  std::atomic<unsigned_short>::atomic
            ((atomic<unsigned_short> *)in_stack_ffffffffffffff30,
             CONCAT11(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff2e));
  CLI::std::array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_3UL>::
  array((array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_3UL> *)
        this_02);
  std::__cxx11::string::string(this_02);
  this_01 = (SimpleQueue<helics::ActionMessage,_std::mutex> *)(in_RDI + 0x1b7);
  memset(this_01,0,4);
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)this_01);
  this_00 = (GlobalFederateId *)((long)&in_RDI[0x1b7]._vptr_Broker + 4);
  memset(this_00,0,4);
  GlobalFederateId::GlobalFederateId(this_00);
  in_RDI[0x1b8]._vptr_Broker = (_func_int **)0x0;
  TVar1 = TimeRepresentation<count_time<9,_long>_>::minVal();
  in_RDI[0x1b9]._vptr_Broker = (_func_int **)TVar1.internalTimeCode;
  TVar1 = TimeRepresentation<count_time<9,_long>_>::minVal();
  in_RDI[0x1ba]._vptr_Broker = (_func_int **)TVar1.internalTimeCode;
  std::atomic<double>::atomic
            ((atomic<double> *)this_01,
             (double)CONCAT17(in_stack_ffffffffffffff2f,
                              CONCAT16(in_stack_ffffffffffffff2e,
                                       CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                                      )));
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  in_RDI[0x1bc]._vptr_Broker = (_func_int **)TVar1.internalTimeCode;
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::SimpleQueue(this_01);
  return;
}

Assistant:

CoreBroker::CoreBroker(std::string_view broker_name):
    BrokerBase(broker_name), timeoutMon(std::make_unique<TimeoutMonitor>())
{
}